

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player_cycle_3.h
# Opt level: O0

void __thiscall PlayerCycle_3::~PlayerCycle_3(PlayerCycle_3 *this)

{
  void *in_RDI;
  
  ~PlayerCycle_3((PlayerCycle_3 *)0x106118);
  operator_delete(in_RDI);
  return;
}

Assistant:

PlayerCycle_3(const std::string& name) :
      Player(name),
      m_play(rand()%3)
   {}